

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVMModule.c
# Opt level: O3

cs_err EVM_global_init(cs_struct *ud)

{
  if (ud->mode != CS_MODE_ARM) {
    return CS_ERR_MODE;
  }
  ud->printer = EVM_printInst;
  ud->printer_info = (void *)0x0;
  ud->insn_id = EVM_get_insn_id;
  ud->insn_name = EVM_insn_name;
  ud->group_name = EVM_group_name;
  ud->disasm = EVM_getInstruction;
  return CS_ERR_OK;
}

Assistant:

cs_err EVM_global_init(cs_struct *ud)
{
	// verify if requested mode is valid
	if (ud->mode)
		return CS_ERR_MODE;

	ud->printer = EVM_printInst;
	ud->printer_info = NULL;
	ud->insn_id = EVM_get_insn_id;
	ud->insn_name = EVM_insn_name;
	ud->group_name = EVM_group_name;
	ud->disasm = EVM_getInstruction;

	return CS_ERR_OK;
}